

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildMethod
          (DescriptorBuilder *this,MethodDescriptorProto *proto,ServiceDescriptor *parent,
          MethodDescriptor *result,FlatAllocator *alloc)

{
  char *pcVar1;
  ushort *puVar2;
  undefined8 *puVar3;
  DescriptorNames DVar4;
  string_view scope;
  string_view name;
  string_view full_name;
  string_view option_name;
  string_view name_00;
  string_view proto_name;
  string_view full_name_00;
  
  result->service_ = parent;
  pcVar1 = (parent->all_names_).payload_;
  scope._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  scope._M_str = pcVar1 + ~scope._M_len;
  puVar3 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  proto_name._M_str = (char *)*puVar3;
  proto_name._M_len = puVar3[1];
  DVar4 = AllocateNameStrings(this,scope,proto_name,&proto->super_Message,alloc);
  (result->all_names_).payload_ = DVar4.payload_;
  puVar3 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  full_name_00._M_len = (ulong)*(ushort *)(DVar4.payload_ + 2);
  full_name_00._M_str = DVar4.payload_ + ~full_name_00._M_len;
  name._M_str = (char *)*puVar3;
  name._M_len = puVar3[1];
  ValidateSymbolName(this,name,full_name_00,&proto->super_Message);
  (result->output_type_).descriptor_ = (Descriptor *)0x0;
  (result->output_type_).once_ = (once_flag *)0x0;
  (result->input_type_).descriptor_ = (Descriptor *)0x0;
  (result->input_type_).once_ = (once_flag *)0x0;
  option_name._M_str = "google.protobuf.MethodOptions";
  option_name._M_len = 0x1d;
  AllocateOptions<google::protobuf::MethodDescriptor>(this,proto,result,4,option_name,alloc);
  result->client_streaming_ = (proto->field_0)._impl_.client_streaming_;
  result->server_streaming_ = (proto->field_0)._impl_.server_streaming_;
  puVar2 = (ushort *)(result->all_names_).payload_;
  full_name._M_len = (ulong)puVar2[1];
  full_name._M_str = (char *)((long)puVar2 + ~full_name._M_len);
  name_00._M_len = (ulong)*puVar2;
  name_00._M_str = (char *)((long)puVar2 + ~name_00._M_len);
  (result->super_SymbolBase).symbol_type_ = '\b';
  AddSymbol(this,full_name,parent,name_00,&proto->super_Message,(Symbol)result);
  return;
}

Assistant:

void DescriptorBuilder::BuildMethod(const MethodDescriptorProto& proto,
                                    const ServiceDescriptor* parent,
                                    MethodDescriptor* result,
                                    internal::FlatAllocator& alloc) {
  result->service_ = parent;
  result->all_names_ =
      AllocateNameStrings(parent->full_name(), proto.name(), proto, alloc);

  ValidateSymbolName(proto.name(), result->full_name(), proto);

  // These will be filled in when cross-linking.
  result->input_type_.Init();
  result->output_type_.Init();

  // Copy options.
  AllocateOptions(proto, result, MethodDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.MethodOptions", alloc);

  result->client_streaming_ = proto.client_streaming();
  result->server_streaming_ = proto.server_streaming();

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}